

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O1

void mean_double_2_suite::test_one(void)

{
  moment<double,_2> filter;
  value_type local_70;
  ulong local_68;
  basic_moment<double,_2UL,_(trial::online::with)1> local_60;
  
  local_60.member.window.super_span<double,_2UL>.member.data = (pointer)&local_60;
  local_60.member.window.super_span<double,_2UL>.member.size = 0;
  local_60.member.window.super_span<double,_2UL>.member.next = 2;
  local_60.member.mean = 0.0;
  trial::online::window::basic_moment<double,_2UL,_(trial::online::with)1>::push
            ((basic_moment<double,_2UL,_(trial::online::with)1> *)
             local_60.member.window.super_span<double,_2UL>.member.data,1.0);
  local_68 = local_68 & 0xffffffffffffff00;
  local_70._0_1_ = (value_type)local_60.member.window.super_span<double,_2UL>.member.size == 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.empty()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x50,"void mean_double_2_suite::test_one()",&local_70,&local_68);
  local_70 = (value_type)
             CONCAT71(local_70._1_7_,
                      (value_type)local_60.member.window.super_span<double,_2UL>.member.size ==
                      9.88131291682493e-324);
  local_68 = local_68 & 0xffffffffffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("filter.full()","false",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x51,"void mean_double_2_suite::test_one()",&local_70,&local_68);
  local_70 = (value_type)local_60.member.window.super_span<double,_2UL>.member.size;
  local_68 = CONCAT44(local_68._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("filter.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x52,"void mean_double_2_suite::test_one()",&local_70,&local_68);
  local_70 = local_60.member.mean;
  local_68 = 0x3ff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/window/moment_suite.cpp"
             ,0x53,"void mean_double_2_suite::test_one()",&local_70,&local_68);
  return;
}

Assistant:

void test_one()
{
    window::moment<double, 2> filter;
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.empty(), false);
    TRIAL_TEST_EQ(filter.full(), false);
    TRIAL_TEST_EQ(filter.size(), 1);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
}